

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O2

void __thiscall
arangodb::velocypack::Validator::validateIndexedObject(Validator *this,uint8_t *ptr,size_t length)

{
  byte bVar1;
  Slice __p;
  unsigned_long uVar2;
  unsigned_long uVar3;
  long lVar4;
  pointer __p_00;
  int64_t iVar5;
  ValueLength length_00;
  ValueLength VVar6;
  iterator __it;
  Exception *pEVar7;
  byte bVar8;
  long lVar9;
  ulong uVar10;
  byte *pbVar11;
  char *msg;
  ValueLength length_01;
  ulong uVar12;
  ulong uVar13;
  byte *ptr_00;
  uint8_t *start;
  byte *pbVar14;
  ulong uVar15;
  Slice key;
  unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  offsetSet;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> tableGuard;
  byte *local_c8;
  ValueLength offset;
  ValueLength tableBuf [16];
  
  bVar1 = *ptr;
  bVar8 = ((bVar1 < 0xf) << 2 | 0xf1U) + bVar1;
  length_01 = 1L << (bVar8 & 0x3f);
  validateBufferLength(this,(2L << (bVar8 & 0x3f)) + 2,length,true);
  uVar2 = readIntegerNonEmpty<unsigned_long>(ptr + 1,length_01);
  if (length < uVar2) {
    pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Object length is out of bounds";
    goto LAB_0010a745;
  }
  if ((bVar1 == 0x12) || (bVar1 == 0xe)) {
    ptr_00 = ptr + uVar2;
    uVar3 = readIntegerNonEmpty<unsigned_long>(ptr_00 + -length_01,length_01);
    if (uVar3 == 0) goto LAB_0010a6d8;
    pbVar14 = ptr_00 + -length_01 + -(uVar3 << (bVar8 & 0x3f));
    if (ptr + length_01 <= pbVar14) {
      lVar4 = length_01 * -2;
LAB_0010a34c:
      if (pbVar14 <= ptr + lVar4 + length) {
        tableGuard._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
        _M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
             (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
        offsetSet._M_t.
        super___uniq_ptr_impl<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        .
        super__Head_base<0UL,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                )0x0;
        __p_00 = tableBuf;
        if (0x10 < uVar3) {
          if (uVar3 < 0x81) {
            __p_00 = (pointer)operator_new__(uVar3 * 8);
            std::__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>::reset
                      ((__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> *)
                       &tableGuard,__p_00);
          }
          else {
            std::
            make_unique<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
                      ();
            __p = key;
            key._start = (uint8_t *)0x0;
            std::
            __uniq_ptr_impl<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
            ::reset((__uniq_ptr_impl<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     *)&offsetSet,(pointer)__p._start);
            std::
            unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
            ::~unique_ptr((unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                           *)&key);
          }
        }
        uVar15 = 0;
        do {
          if (pbVar14 <= ptr_00) {
            if (uVar15 < uVar3) {
              pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
              Exception::Exception
                        (pEVar7,ValidatorInvalidLength,"Object has fewer items than in index");
              __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
            }
            if (uVar3 < 0x81) {
              for (uVar15 = 0; uVar15 != uVar3; uVar15 = uVar15 + 1) {
                uVar2 = readIntegerNonEmpty<unsigned_long>
                                  (pbVar14 + (uVar15 << (bVar8 & 0x3f)),length_01);
                uVar13 = 0;
                uVar12 = uVar3;
                while( true ) {
                  uVar10 = uVar12;
                  if (uVar10 <= uVar13) {
                    pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
                    Exception::Exception
                              (pEVar7,ValidatorInvalidLength,"Object has invalid index offset");
                    __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
                  }
                  uVar12 = uVar10 + uVar13 >> 1;
                  if (uVar2 == __p_00[uVar12]) break;
                  if (__p_00[uVar12] <= uVar2) {
                    uVar13 = uVar12 + 1;
                    uVar12 = uVar10;
                  }
                }
              }
            }
            else {
              for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
                key._start = (uint8_t *)
                             readIntegerNonEmpty<unsigned_long>
                                       (pbVar14 + (uVar15 << (bVar8 & 0x3f)),length_01);
                __it = std::
                       _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::find((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                               *)offsetSet._M_t.
                                 super___uniq_ptr_impl<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_*,_false>
                                 ._M_head_impl,(key_type *)&key);
                if (__it.super__Node_iterator_base<unsigned_long,_false>._M_cur ==
                    (__node_type *)0x0) {
                  pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
                  Exception::Exception
                            (pEVar7,ValidatorInvalidLength,"Object has invalid index offset");
                  __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
                }
                std::
                _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::erase((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)offsetSet._M_t.
                           super___uniq_ptr_impl<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                           .
                           super__Head_base<0UL,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_*,_false>
                           ._M_head_impl,
                        (const_iterator)__it.super__Node_iterator_base<unsigned_long,_false>._M_cur)
                ;
              }
            }
            std::
            unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
            ::~unique_ptr(&offsetSet);
            std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
                      (&tableGuard);
            return;
          }
          validatePart(this,ptr_00,(long)pbVar14 - (long)ptr_00,true);
          bVar1 = *ptr_00;
          key._start = ptr_00;
          if (0x7f < (ulong)bVar1 - 0x40) {
            if ((bVar1 & 0xf0) == 0x30) {
              iVar5 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                      getSmallInt((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)&key);
              if (iVar5 < 1) {
LAB_0010a657:
                pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
                Exception::Exception(pEVar7,ValidatorInvalidLength,"Invalid object key type");
                __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
              }
            }
            else if ((bVar1 & 0xf8) != 0x28) goto LAB_0010a657;
          }
          length_00 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                                ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                  *)&key);
          if (((ulong)bVar1 - 0x40 < 0x80) && (this->options->validateUtf8Strings == true)) {
            validatePart(this,ptr_00,length_00,true);
          }
          pbVar11 = ptr_00 + length_00;
          if (pbVar14 <= pbVar11) {
            pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
            Exception::Exception
                      (pEVar7,ValidatorInvalidLength,"Object value leaking into index table");
            __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
          }
          validatePart(this,pbVar11,(long)pbVar14 - (long)pbVar11,true);
          offset = (long)ptr_00 - (long)ptr;
          if (uVar3 < 0x81) {
            __p_00[uVar15] = offset;
          }
          else {
            std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::_M_emplace<unsigned_long&>
                      ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)offsetSet._M_t.
                          super___uniq_ptr_impl<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                          .
                          super__Head_base<0UL,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_*,_false>
                          ._M_head_impl,&offset);
          }
          local_c8 = pbVar11;
          VVar6 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                             &local_c8);
          uVar15 = uVar15 + 1;
          if (uVar3 < uVar15) {
            pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
            Exception::Exception
                      (pEVar7,ValidatorInvalidLength,
                       "Object value has more key/value pairs than announced");
            __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
          }
          ptr_00 = ptr_00 + VVar6 + length_00;
        } while( true );
      }
    }
  }
  else {
    start = ptr + 1 + length_01;
    uVar3 = readIntegerNonEmpty<unsigned_long>(start,length_01);
    if (uVar3 == 0) {
LAB_0010a6d8:
      pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Object nrItems value is invalid";
      goto LAB_0010a745;
    }
    lVar4 = -2L << (bVar8 & 0x3f);
    pbVar14 = ptr + uVar2;
    pbVar11 = start + lVar4 + length_01 + 8;
    if (pbVar14 < start + lVar4 + length_01 + 8) {
      pbVar11 = pbVar14;
    }
    for (lVar9 = 0; (ptr_00 = start + lVar9 + length_01, ptr_00 < pbVar11 && (*ptr_00 == 0));
        lVar9 = lVar9 + 1) {
    }
    if ((lVar9 != 0) && (lVar4 + 8 != lVar9)) {
      pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Object padding is invalid";
      goto LAB_0010a745;
    }
    pbVar14 = pbVar14 + -(uVar3 << (bVar8 & 0x3f));
    if ((ptr + length_01 * 2 <= pbVar14) && (ptr_00 <= pbVar14)) {
      lVar4 = -length_01;
      goto LAB_0010a34c;
    }
  }
  pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
  msg = "Object index table is out of bounds";
LAB_0010a745:
  Exception::Exception(pEVar7,ValidatorInvalidLength,msg);
  __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateIndexedObject(uint8_t const* ptr, std::size_t length) {
  // Object with index table, with 1-8 bytes lengths
  uint8_t head = *ptr;
  ValueLength byteSizeLength;
  if (VELOCYPACK_UNLIKELY(head >= 0x0f)) {
    byteSizeLength = 1ULL << (static_cast<ValueLength>(head) - 0x0fU);
  } else {
    byteSizeLength = 1ULL << (static_cast<ValueLength>(head) - 0x0bU);
  }
  VELOCYPACK_ASSERT(byteSizeLength > 0);
  validateBufferLength(1 + byteSizeLength + byteSizeLength + 1, length, true);
  ValueLength const byteSize =
      readIntegerNonEmpty<ValueLength>(ptr + 1, byteSizeLength);

  if (byteSize > length) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Object length is out of bounds");
  }

  ValueLength nrItems;
  uint8_t const* indexTable;
  uint8_t const* firstMember;

  if (head == 0x0eU || head == 0x12U) {
    // byte length = 8
    nrItems = readIntegerNonEmpty<ValueLength>(ptr + byteSize - byteSizeLength,
                                               byteSizeLength);

    if (nrItems == 0) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object nrItems value is invalid");
    }

    indexTable = ptr + byteSize - byteSizeLength - (nrItems * byteSizeLength);
    if (indexTable < ptr + byteSizeLength ||
        indexTable > ptr + length - byteSizeLength - byteSizeLength) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object index table is out of bounds");
    }

    firstMember = ptr + byteSize;
  } else {
    // byte length = 1, 2 or 4
    nrItems = readIntegerNonEmpty<ValueLength>(ptr + 1 + byteSizeLength,
                                               byteSizeLength);

    if (nrItems == 0) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object nrItems value is invalid");
    }

    // look up first member
    uint8_t const* p = ptr + 1 + byteSizeLength + byteSizeLength;
    uint8_t const* e = p + (8 - byteSizeLength - byteSizeLength);
    if (e > ptr + byteSize) {
      e = ptr + byteSize;
    }
    while (p < e && *p == '\x00') {
      ++p;
    }

    // check if padding is correct
    if (p != ptr + 1 + byteSizeLength + byteSizeLength &&
        p != ptr + 1 + byteSizeLength + byteSizeLength +
                 (8 - byteSizeLength - byteSizeLength)) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object padding is invalid");
    }

    indexTable = ptr + byteSize - (nrItems * byteSizeLength);
    if (indexTable < ptr + byteSizeLength + byteSizeLength || indexTable < p ||
        indexTable > ptr + length - byteSizeLength) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object index table is out of bounds");
    }

    firstMember = p;
  }

  VELOCYPACK_ASSERT(nrItems > 0);

  ValueLength tableBuf[16];  // Fixed space to save offsets found sequentially
  ValueLength* table = tableBuf;
  std::unique_ptr<ValueLength[]> tableGuard;
  std::unique_ptr<std::unordered_set<ValueLength>> offsetSet;
  if (nrItems > 16) {
    if (nrItems <= 128) {
      table = new ValueLength[nrItems];  // throws if bad_alloc
      tableGuard.reset(table);           // for automatic deletion
    } else {
      // if we have even more items, we directly create an unordered_set
      offsetSet = std::make_unique<std::unordered_set<ValueLength>>();
    }
  }
  ValueLength actualNrItems = 0;
  uint8_t const* member = firstMember;
  while (member < indexTable) {
    validatePart(member, indexTable - member, true);

    Slice key(member);
    bool const isString = key.isString();
    if (!isString) {
      bool const isSmallInt = key.isSmallInt();
      if ((!isSmallInt && !key.isUInt()) ||
          (isSmallInt && key.getSmallInt() <= 0)) {
        throw Exception(Exception::ValidatorInvalidLength,
                        "Invalid object key type");
      }
    }

    ValueLength const keySize = key.byteSize();
    if (isString && options->validateUtf8Strings) {
      validatePart(member, keySize, true);
    }

    uint8_t const* value = member + keySize;
    if (value >= indexTable) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object value leaking into index table");
    }
    validatePart(value, indexTable - value, true);

    ValueLength offset = static_cast<ValueLength>(member - ptr);
    if (nrItems <= 128) {
      table[actualNrItems] = offset;
    } else {
      offsetSet->emplace(offset);
    }

    member += keySize + Slice(value).byteSize();
    ++actualNrItems;

    if (actualNrItems > nrItems) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object value has more key/value pairs than announced");
    }
  }

  if (actualNrItems < nrItems) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Object has fewer items than in index");
  }

  // Finally verify each offset in the index:
  if (nrItems <= 128) {
    for (ValueLength pos = 0; pos < nrItems; ++pos) {
      ValueLength offset = readIntegerNonEmpty<ValueLength>(
          indexTable + pos * byteSizeLength, byteSizeLength);
      // Binary search in sorted index list:
      ValueLength low = 0;
      ValueLength high = nrItems;
      bool found = false;
      while (low < high) {
        ValueLength mid = (low + high) / 2;
        if (offset == table[mid]) {
          found = true;
          break;
        } else if (offset < table[mid]) {
          high = mid;
        } else {  // offset > table[mid]
          low = mid + 1;
        }
      }
      if (!found) {
        throw Exception(Exception::ValidatorInvalidLength,
                        "Object has invalid index offset");
      }
    }
  } else {
    for (ValueLength pos = 0; pos < nrItems; ++pos) {
      ValueLength offset = readIntegerNonEmpty<ValueLength>(
          indexTable + pos * byteSizeLength, byteSizeLength);
      auto i = offsetSet->find(offset);
      if (i == offsetSet->end()) {
        throw Exception(Exception::ValidatorInvalidLength,
                        "Object has invalid index offset");
      }
      offsetSet->erase(i);
    }
  }
}